

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O2

int __thiscall embree::LineCommentFilter::next(LineCommentFilter *this)

{
  Stream<int> *this_00;
  int iVar1;
  int *piVar2;
  ulong n;
  
  n = 0;
  do {
    if ((this->lineComment)._M_string_length <= n) {
      while ((piVar2 = Stream<int>::peek((this->cin).ptr), *piVar2 != 10 &&
             (piVar2 = Stream<int>::peek((this->cin).ptr), *piVar2 != -1))) {
        Stream<int>::get((this->cin).ptr);
      }
LAB_0012b9fd:
      iVar1 = Stream<int>::get((this->cin).ptr);
      return iVar1;
    }
    piVar2 = Stream<int>::peek((this->cin).ptr);
    this_00 = (this->cin).ptr;
    if (*piVar2 != (int)(this->lineComment)._M_dataplus._M_p[n]) {
      Stream<int>::unget(this_00,n);
      goto LAB_0012b9fd;
    }
    Stream<int>::get(this_00);
    n = n + 1;
  } while( true );
}

Assistant:

int next()
    {
      /* look if the line comment starts here */
      for (size_t j=0; j<lineComment.size(); j++) {
        if (cin->peek() != lineComment[j]) { cin->unget(j); goto not_found; }
        cin->get();
      }
      /* eat all characters until the end of the line (or file) */
      while (cin->peek() != '\n' && cin->peek() != EOF) cin->get();

    not_found:
      return cin->get();
    }